

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O2

void __thiscall ProxyLine::onRead(ProxyLine *this)

{
  String *this_00;
  ICallback *pIVar1;
  usize uVar2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  char *pcVar6;
  time_t tVar7;
  Client *this_01;
  usize postponed;
  char *pcStack_40060;
  usize uStack_40058;
  usize uStack_40048;
  usize size;
  byte buffer [262145];
  
  sVar4 = Server::Client::read(this->_handle,(int)buffer,(void *)0x40000,(size_t)&size);
  if ((char)sVar4 == '\0') {
    return;
  }
  if (this->_connected == true) {
    postponed = 0;
    this_01 = this->_client;
    sVar4 = Server::Client::write(this_01,(int)buffer,(void *)size,(size_t)&postponed);
    if ((char)sVar4 == '\0') {
      return;
    }
    if (postponed != 0) {
      this_01 = this->_handle;
      Server::Client::suspend(this_01);
    }
LAB_00107847:
    tVar7 = Time::time((time_t *)this_01);
    this->_lastReadActivity = tVar7;
  }
  else {
    buffer[size] = '\0';
    this_00 = &this->_proxyResponse;
    String::append(this_00,(char *)buffer,size);
    pcVar5 = String::find(this_00,"\r\n\r\n");
    if (pcVar5 == (char *)0x0) {
      if (this_00->data->len < 0x101) {
        return;
      }
      postponed = (usize)&pcStack_40060;
      uStack_40048 = 0;
      pcStack_40060 = "Invalid HTTP reponse";
      uStack_40058 = 0x14;
      (*this->_callback->_vptr_ICallback[1])(this->_callback,this,&postponed);
    }
    else {
      postponed = (usize)&pcStack_40060;
      uStack_40048 = 0;
      pcStack_40060 = "HTTP/1.1 200 ";
      uStack_40058 = 0xd;
      iVar3 = String::compare(this_00,(String *)&postponed,0xd);
      String::~String((String *)&postponed);
      if (iVar3 == 0) {
        uVar2 = this_00->data->len;
        pcVar6 = String::operator_cast_to_char_(this_00);
        if (pcVar6 + (uVar2 - (long)(pcVar5 + 4)) != (char *)0x0) {
          Server::Client::write
                    (this->_client,(int)(pcVar5 + 4),pcVar6 + (uVar2 - (long)(pcVar5 + 4)),0);
        }
        postponed = (usize)&String::emptyData;
        String::operator=(this_00,(String *)&postponed);
        String::~String((String *)&postponed);
        this->_connected = true;
        this_01 = (Client *)this->_callback;
        (*(code *)**(undefined8 **)this_01)(this_01,this);
        goto LAB_00107847;
      }
      pcVar5 = String::find(this_00,"\r\n");
      pIVar1 = this->_callback;
      pcVar6 = String::operator_cast_to_char_(this_00);
      String::substr((String *)&postponed,this_00,0,(long)pcVar5 - (long)pcVar6);
      (*pIVar1->_vptr_ICallback[1])(pIVar1,this,&postponed);
    }
    String::~String((String *)&postponed);
  }
  return;
}

Assistant:

void ProxyLine::onRead()
{
    byte buffer[262144 + 1];
    usize size;
    if (!_handle->read(buffer, sizeof(buffer) - 1, size))
        return;
    if (_connected)
    {
        usize postponed = 0;
        if (!_client.write(buffer, size, &postponed))
            return;
        if (postponed)
            _handle->suspend();
        _lastReadActivity = Time::time();
    }
    else
    {
        buffer[size] = '\0';
        _proxyResponse.append((const char*)buffer, size);
        // expecting "HTTP/1.1 200 Connection established\r\n\r\n"
        const char* headerEnd = _proxyResponse.find("\r\n\r\n");
        if (headerEnd)
        {
            if (_proxyResponse.compare("HTTP/1.1 200 ", 13) == 0)
            {
                const char* bufferPos = headerEnd + 4;
                usize remainingSize = _proxyResponse.length() - (bufferPos - (const char*)_proxyResponse);
                if (remainingSize)
                    _client.write((const byte*)bufferPos, remainingSize);
                _proxyResponse = String();
                _connected = true;
                _callback.onOpened(*this);
                _lastReadActivity = Time::time();
            }
            else
            {
                const char* firstLineEnd = _proxyResponse.find("\r\n");
                _callback.onClosed(*this, _proxyResponse.substr(0, firstLineEnd - (const char*)_proxyResponse));
            }
        }
        else if (_proxyResponse.length() > 256)
            _callback.onClosed(*this, "Invalid HTTP reponse");
    }
}